

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::IfcOccupant(IfcOccupant *this)

{
  *(undefined ***)&this->field_0x120 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x128 = 0;
  *(char **)&this->field_0x130 = "IfcOccupant";
  IfcActor::IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__00796508);
  *(undefined8 *)&(this->super_IfcActor).field_0xf8 = 0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0x796428;
  *(undefined8 *)&this->field_0x120 = 0x7964f0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0x796450;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x796478;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0x7964a0;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0x7964c8;
  *(undefined1 **)&(this->super_IfcActor).field_0x100 = &this->field_0x110;
  *(undefined8 *)&this->field_0x108 = 0;
  this->field_0x110 = 0;
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}